

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

int __thiscall
baryonyx::itm::compute_order::
infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>const,baryonyx::bit_array>
          (compute_order *this,
          solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
          *solver,bit_array *x)

{
  int iVar1;
  int iVar2;
  int local_74;
  pair<int,_int> local_70;
  int local_68;
  pair<int,_int> local_64;
  int local_5c;
  tuple<baryonyx::sparse_matrix<int>::row_value_const*&,baryonyx::sparse_matrix<int>::row_value_const*&>
  local_58 [4];
  int v;
  undefined1 local_48 [24];
  const_row_iterator et;
  const_row_iterator it;
  int e;
  int k;
  bit_array *x_local;
  solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
  *solver_local;
  compute_order *this_local;
  
  _e = x;
  x_local = (bit_array *)solver;
  solver_local = (solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                  *)this;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::clear(&this->m_order);
  it._4_4_ = 0;
  it._0_4_ = *(int *)&x_local[8].super_bit_array_impl.m_data._M_t.
                      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                      .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  for (; it._4_4_ != (int)it; it._4_4_ = it._4_4_ + 1) {
    sparse_matrix<int>::row((sparse_matrix<int> *)local_48,(int)x_local + 0x10);
    std::
    tie<baryonyx::sparse_matrix<int>::row_value_const*,baryonyx::sparse_matrix<int>::row_value_const*>
              ((row_value **)local_58,&et);
    std::
    tuple<baryonyx::sparse_matrix<int>::row_value_const*&,baryonyx::sparse_matrix<int>::row_value_const*&>
    ::operator=(local_58,(tuple<const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
                          *)local_48);
    local_5c = 0;
    for (; et != (const_row_iterator)local_48._16_8_; et = et + 1) {
      iVar1 = solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
              ::factor((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                        *)x_local,et->value);
      iVar2 = bit_array::operator[](_e,et->column);
      local_5c = iVar1 * iVar2 + local_5c;
    }
    iVar1 = solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
            ::bound_min((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                         *)x_local,it._4_4_);
    if (local_5c < iVar1) {
      local_68 = solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                 ::bound_min((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                              *)x_local,it._4_4_);
      local_68 = local_68 - local_5c;
      local_64 = std::make_pair<int&,int>((int *)((long)&it + 4),&local_68);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (&this->m_order,&local_64);
    }
    else {
      iVar2 = solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
              ::bound_max((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                           *)x_local,it._4_4_);
      iVar1 = local_5c;
      if (iVar2 < local_5c) {
        local_74 = solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                   ::bound_max((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                                *)x_local,it._4_4_);
        local_74 = iVar1 - local_74;
        local_70 = std::make_pair<int&,int>((int *)((long)&it + 4),&local_74);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  (&this->m_order,&local_70);
      }
    }
  }
  iVar1 = length<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>(&this->m_order)
  ;
  return iVar1;
}

Assistant:

int infeasibility_local_compute_violated_constraints(Solver& solver,
                                                         const Xtype& x)
    {
        m_order.clear();

        for (int k = 0, e = solver.m; k != e; ++k) {
            sparse_matrix<int>::const_row_iterator it, et;
            std::tie(it, et) = solver.ap.row(k);
            int v = 0;

            for (; it != et; ++it)
                v += solver.factor(it->value) * x[it->column];

            if (solver.bound_min(k) > v)
                m_order.push_back(std::make_pair(k, solver.bound_min(k) - v));
            else if (solver.bound_max(k) < v)
                m_order.push_back(std::make_pair(k, v - solver.bound_max(k)));
        }

        return length(m_order);
    }